

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

void ikcp_ack_push(ikcpcb *kcp,IUINT32 sn,IUINT32 ts)

{
  IUINT32 IVar1;
  uint uVar2;
  IUINT32 *pIVar3;
  uint local_38;
  uint local_34;
  IUINT32 x;
  IUINT32 newblock;
  IUINT32 *acklist;
  IUINT32 *ptr;
  IUINT32 newsize;
  IUINT32 ts_local;
  IUINT32 sn_local;
  ikcpcb *kcp_local;
  
  uVar2 = kcp->ackcount + 1;
  if (kcp->ackblock < uVar2) {
    for (local_34 = 8; local_34 < uVar2; local_34 = local_34 << 1) {
    }
    pIVar3 = (IUINT32 *)ikcp_malloc((ulong)local_34 << 3);
    if (pIVar3 == (IUINT32 *)0x0) {
      __assert_fail("acklist != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                    ,0x28a,"void ikcp_ack_push(ikcpcb *, IUINT32, IUINT32)");
    }
    if (kcp->acklist != (IUINT32 *)0x0) {
      for (local_38 = 0; local_38 < kcp->ackcount; local_38 = local_38 + 1) {
        pIVar3[local_38 << 1] = kcp->acklist[local_38 << 1];
        pIVar3[local_38 * 2 + 1] = kcp->acklist[local_38 * 2 + 1];
      }
      ikcp_free(kcp->acklist);
    }
    kcp->acklist = pIVar3;
    kcp->ackblock = local_34;
  }
  pIVar3 = kcp->acklist;
  IVar1 = kcp->ackcount;
  pIVar3[IVar1 << 1] = sn;
  (pIVar3 + (IVar1 << 1))[1] = ts;
  kcp->ackcount = kcp->ackcount + 1;
  return;
}

Assistant:

static void ikcp_ack_push(ikcpcb *kcp, IUINT32 sn, IUINT32 ts)
{
	IUINT32 newsize = kcp->ackcount + 1;
	IUINT32 *ptr;

	if (newsize > kcp->ackblock) {
		IUINT32 *acklist;
		IUINT32 newblock;

		for (newblock = 8; newblock < newsize; newblock <<= 1);
		acklist = (IUINT32*)ikcp_malloc(newblock * sizeof(IUINT32) * 2);

		if (acklist == NULL) {
			assert(acklist != NULL);
			abort();
		}

		if (kcp->acklist != NULL) {
			IUINT32 x;
			for (x = 0; x < kcp->ackcount; x++) {
				acklist[x * 2 + 0] = kcp->acklist[x * 2 + 0];
				acklist[x * 2 + 1] = kcp->acklist[x * 2 + 1];
			}
			ikcp_free(kcp->acklist);
		}

		kcp->acklist = acklist;
		kcp->ackblock = newblock;
	}

	ptr = &kcp->acklist[kcp->ackcount * 2];
	ptr[0] = sn;
	ptr[1] = ts;
	kcp->ackcount++;
}